

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArchiveWrite.cxx
# Opt level: O2

void __thiscall
cmArchiveWrite::cmArchiveWrite(cmArchiveWrite *this,ostream *os,Compress c,string *format)

{
  string *psVar1;
  int iVar2;
  archive *paVar3;
  string local_40;
  
  this->Stream = os;
  paVar3 = archive_write_new();
  this->Archive = paVar3;
  paVar3 = archive_read_disk_new();
  this->Disk = paVar3;
  this->Verbose = false;
  (this->Error)._M_dataplus._M_p = (pointer)&(this->Error).field_2;
  (this->Error)._M_string_length = 0;
  (this->Error).field_2._M_local_buf[0] = '\0';
  (this->MTime)._M_dataplus._M_p = (pointer)&(this->MTime).field_2;
  (this->MTime)._M_string_length = 0;
  psVar1 = &this->Error;
  (this->MTime).field_2._M_local_buf[0] = '\0';
  switch(c) {
  case CompressNone:
    iVar2 = archive_write_set_compression_none(this->Archive);
    if (iVar2 != 0) {
      std::__cxx11::string::assign((char *)psVar1);
      cm_archive_error_string_abi_cxx11_(&local_40,this->Archive);
      std::__cxx11::string::append((string *)psVar1);
      goto LAB_0012ef00;
    }
    break;
  case CompressCompress:
    iVar2 = archive_write_set_compression_compress(this->Archive);
    if (iVar2 != 0) {
      std::__cxx11::string::assign((char *)psVar1);
      cm_archive_error_string_abi_cxx11_(&local_40,this->Archive);
      std::__cxx11::string::append((string *)psVar1);
      goto LAB_0012ef00;
    }
    break;
  case CompressGZip:
    iVar2 = archive_write_set_compression_gzip(this->Archive);
    if (iVar2 != 0) {
      std::__cxx11::string::assign((char *)psVar1);
      cm_archive_error_string_abi_cxx11_(&local_40,this->Archive);
      std::__cxx11::string::append((string *)psVar1);
      goto LAB_0012ef00;
    }
    break;
  case CompressBZip2:
    iVar2 = archive_write_set_compression_bzip2(this->Archive);
    if (iVar2 != 0) {
      std::__cxx11::string::assign((char *)psVar1);
      cm_archive_error_string_abi_cxx11_(&local_40,this->Archive);
      std::__cxx11::string::append((string *)psVar1);
      goto LAB_0012ef00;
    }
    break;
  case CompressLZMA:
    iVar2 = archive_write_set_compression_lzma(this->Archive);
    if (iVar2 != 0) {
      std::__cxx11::string::assign((char *)psVar1);
      cm_archive_error_string_abi_cxx11_(&local_40,this->Archive);
      std::__cxx11::string::append((string *)psVar1);
      goto LAB_0012ef00;
    }
    break;
  case CompressXZ:
    iVar2 = archive_write_set_compression_xz(this->Archive);
    if (iVar2 != 0) {
      std::__cxx11::string::assign((char *)psVar1);
      cm_archive_error_string_abi_cxx11_(&local_40,this->Archive);
      std::__cxx11::string::append((string *)psVar1);
      goto LAB_0012ef00;
    }
  }
  iVar2 = archive_read_disk_set_standard_lookup(this->Disk);
  if (iVar2 == 0) {
    iVar2 = archive_write_set_format_by_name(this->Archive,(format->_M_dataplus)._M_p);
    if (iVar2 == 0) {
      iVar2 = archive_write_set_bytes_in_last_block(this->Archive,1);
      if (iVar2 == 0) {
        iVar2 = archive_write_open(this->Archive,this,(undefined1 *)0x0,Callback::Write,
                                   (undefined1 *)0x0);
        if (iVar2 == 0) {
          return;
        }
        std::__cxx11::string::assign((char *)psVar1);
        cm_archive_error_string_abi_cxx11_(&local_40,this->Archive);
        std::__cxx11::string::append((string *)psVar1);
      }
      else {
        std::__cxx11::string::assign((char *)psVar1);
        cm_archive_error_string_abi_cxx11_(&local_40,this->Archive);
        std::__cxx11::string::append((string *)psVar1);
      }
    }
    else {
      std::__cxx11::string::assign((char *)psVar1);
      cm_archive_error_string_abi_cxx11_(&local_40,this->Archive);
      std::__cxx11::string::append((string *)psVar1);
    }
  }
  else {
    std::__cxx11::string::assign((char *)psVar1);
    cm_archive_error_string_abi_cxx11_(&local_40,this->Archive);
    std::__cxx11::string::append((string *)psVar1);
  }
LAB_0012ef00:
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

cmArchiveWrite::cmArchiveWrite(
  std::ostream& os, Compress c, std::string const& format):
    Stream(os),
    Archive(archive_write_new()),
    Disk(archive_read_disk_new()),
    Verbose(false)
{
  switch (c)
    {
    case CompressNone:
      if(archive_write_set_compression_none(this->Archive) != ARCHIVE_OK)
        {
        this->Error = "archive_write_set_compression_none: ";
        this->Error += cm_archive_error_string(this->Archive);
        return;
        }
      break;
    case CompressCompress:
      if(archive_write_set_compression_compress(this->Archive) != ARCHIVE_OK)
        {
        this->Error = "archive_write_set_compression_compress: ";
        this->Error += cm_archive_error_string(this->Archive);
        return;
        }
      break;
    case CompressGZip:
      if(archive_write_set_compression_gzip(this->Archive) != ARCHIVE_OK)
        {
        this->Error = "archive_write_set_compression_gzip: ";
        this->Error += cm_archive_error_string(this->Archive);
        return;
        }
      break;
    case CompressBZip2:
      if(archive_write_set_compression_bzip2(this->Archive) != ARCHIVE_OK)
        {
        this->Error = "archive_write_set_compression_bzip2: ";
        this->Error += cm_archive_error_string(this->Archive);
        return;
        }
      break;
    case CompressLZMA:
      if(archive_write_set_compression_lzma(this->Archive) != ARCHIVE_OK)
        {
        this->Error = "archive_write_set_compression_lzma: ";
        this->Error += cm_archive_error_string(this->Archive);
        return;
        }
      break;
    case CompressXZ:
      if(archive_write_set_compression_xz(this->Archive) != ARCHIVE_OK)
        {
        this->Error = "archive_write_set_compression_xz: ";
        this->Error += cm_archive_error_string(this->Archive);
        return;
        }
      break;
    };
#if !defined(_WIN32) || defined(__CYGWIN__)
  if (archive_read_disk_set_standard_lookup(this->Disk) != ARCHIVE_OK)
    {
    this->Error = "archive_read_disk_set_standard_lookup: ";
    this->Error += cm_archive_error_string(this->Archive);
    return;
    }
#endif

  if(archive_write_set_format_by_name(this->Archive, format.c_str())
    != ARCHIVE_OK)
    {
    this->Error = "archive_write_set_format_by_name: ";
    this->Error += cm_archive_error_string(this->Archive);
    return;
    }

  // do not pad the last block!!
  if (archive_write_set_bytes_in_last_block(this->Archive, 1))
    {
    this->Error = "archive_write_set_bytes_in_last_block: ";
    this->Error += cm_archive_error_string(this->Archive);
    return;
    }

  if(archive_write_open(
       this->Archive, this, 0,
       reinterpret_cast<archive_write_callback*>(&Callback::Write),
       0) != ARCHIVE_OK)
    {
    this->Error = "archive_write_open: ";
    this->Error += cm_archive_error_string(this->Archive);
    return;
    }
}